

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O1

uint32_t phf_g<std::__cxx11::string>
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k,
                   uint32_t seed)

{
  pointer pcVar1;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint *local_40;
  long local_38;
  uint local_30 [4];
  
  uVar5 = (ulong)seed;
  pcVar1 = (k->_M_dataplus)._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>((string *)&local_40,pcVar1,pcVar1 + k->_M_string_length)
  ;
  puVar2 = local_40;
  do {
    uVar4 = 0;
    uVar3 = 0;
    switch(local_38) {
    case 3:
      uVar3 = (uint)*(byte *)((long)puVar2 + 2) << 8;
    case 2:
      uVar4 = uVar3 | (uint)*(byte *)((long)puVar2 + 1) << 0x10;
    case 1:
      uVar3 = (((uint)(byte)*puVar2 << 0x18 | uVar4) * -0x3361d2af >> 0x11 | uVar4 * 0x16a88000) *
              0x1b873593 ^ (uint)uVar5;
      uVar5 = (ulong)((uVar3 << 0xd | uVar3 >> 0x13) * 5 + 0xe6546b64);
    case 0:
      if (local_40 != local_30) {
        operator_delete(local_40);
      }
      uVar3 = ((uint)(uVar5 >> 0x10) ^ (uint)uVar5) * -0x7a143595;
      uVar3 = (uVar3 >> 0xd ^ uVar3) * -0x3d4d51cb;
      return uVar3 >> 0x10 ^ uVar3;
    default:
      uVar3 = *puVar2;
      uVar4 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8;
      uVar3 = ((uVar4 | uVar3 << 0x18) * -0x3361d2af >> 0x11 | uVar4 * 0x16a88000) * 0x1b873593 ^
              (uint)uVar5;
      uVar5 = (ulong)((uVar3 << 0xd | uVar3 >> 0x13) * 5 + 0xe6546b64);
      puVar2 = puVar2 + 1;
      local_38 = local_38 + -4;
    }
  } while( true );
}

Assistant:

static inline uint32_t phf_g(T k, uint32_t seed) {
	uint32_t h1 = seed;

	h1 = phf_round32(k, h1);

	return phf_mix32(h1);
}